

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

void djb::fresnel::f0_to_ior(float_t f0,float_t *ior)

{
  float fVar1;
  float_t fVar2;
  
  if (ior != (float_t *)0x0) {
    fVar2 = 1.0;
    if ((f0 != 1.0) || (NAN(f0))) {
      if (f0 < 0.0) {
        fVar1 = sqrtf(f0);
      }
      else {
        fVar1 = SQRT(f0);
      }
      fVar2 = (fVar1 + 1.0) / (1.0 - fVar1);
    }
    *ior = fVar2;
    return;
  }
  __assert_fail("ior && \"Null output ptr\"",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                ,0x454,"void djb::fresnel::f0_to_ior(float_t, float_t *)");
}

Assistant:

void f0_to_ior(float_t f0, float_t *ior)
{
	DJB_ASSERT(ior && "Null output ptr");
	if (f0 == 1) {
		(*ior) = 1;
	} else {
		float_t sqrt_f0 = sqrt(f0);

		(*ior) = (1 + sqrt_f0) / (1 - sqrt_f0);
	}
}